

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  uint uVar5;
  LogMessage *pLVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte *pbVar11;
  bool bVar12;
  pair<unsigned_long,_bool> pVar13;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  puVar4 = this->buffer_end_;
  if (((int)puVar4 - (int)this->buffer_ < 10) &&
     ((puVar4 <= this->buffer_ || ((char)puVar4[-1] < '\0')))) {
    pVar13 = ReadVarint64Fallback(this);
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return -1;
    }
    return (ulong)(uint)pVar13.first;
  }
  if (first_byte_or_zero == 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1ce);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (first_byte_or_zero) != (0): ");
    pLVar6 = internal::LogMessage::operator<<
                       (pLVar6,"Caller should provide us with *buffer_ when buffer is non-empty");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar6);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pbVar11 = this->buffer_;
  if (*pbVar11 != first_byte_or_zero) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x175);
    pLVar6 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (*buffer) == (first_byte): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar6);
    internal::LogMessage::~LogMessage(&local_98);
  }
  if (-1 < (char)first_byte_or_zero) {
    internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x176);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_d0,"CHECK failed: (first_byte & 0x80) == (0x80): ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,first_byte_or_zero);
    internal::LogFinisher::operator=(&local_d1,pLVar6);
    internal::LogMessage::~LogMessage(&local_d0);
  }
  uVar5 = ((uint)pbVar11[1] * 0x80 + first_byte_or_zero) - 0x80;
  if ((char)pbVar11[1] < '\0') {
    uVar5 = (uVar5 + (uint)pbVar11[2] * 0x4000) - 0x4000;
    if ((char)pbVar11[2] < '\0') {
      uVar5 = (uVar5 + (uint)pbVar11[3] * 0x200000) - 0x200000;
      if ((char)pbVar11[3] < '\0') {
        uVar5 = uVar5 + (uint)pbVar11[4] * 0x10000000 + 0xf0000000;
        if ((char)pbVar11[4] < '\0') {
          pbVar3 = pbVar11 + 6;
          if ((char)pbVar11[5] < '\0') {
            pbVar11 = pbVar11 + 10;
            lVar10 = 0;
            do {
              uVar8 = (uint)lVar10;
              if (uVar8 == 4) goto LAB_0031ffca;
              lVar1 = lVar10 + 1;
              pbVar2 = pbVar3 + lVar10;
              lVar10 = lVar1;
            } while ((char)*pbVar2 < '\0');
            pbVar11 = pbVar3 + lVar1;
LAB_0031ffca:
            bVar12 = 3 < uVar8;
          }
          else {
            bVar12 = false;
            pbVar11 = pbVar3;
          }
          if (bVar12) {
            uVar9 = 0;
            bVar12 = false;
            goto LAB_0031ff77;
          }
        }
        else {
          pbVar11 = pbVar11 + 5;
        }
      }
      else {
        pbVar11 = pbVar11 + 4;
      }
    }
    else {
      pbVar11 = pbVar11 + 3;
    }
  }
  else {
    pbVar11 = pbVar11 + 2;
  }
  uVar9 = (ulong)uVar5;
  bVar12 = true;
LAB_0031ff77:
  uVar7 = 0xffffffffffffffff;
  if (bVar12) {
    this->buffer_ = pbVar11;
    uVar7 = uVar9;
  }
  return uVar7;
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}